

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

CodeLocation __thiscall
soul::SimpleTokeniser::findEndOfMatchingDelimiter
          (SimpleTokeniser *this,CodeLocation *start,TokenType openDelim,TokenType closeDelim)

{
  bool bVar1;
  int iVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar3;
  CodeLocation CVar4;
  SimpleTokeniser tokeniser;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  TStack_98;
  
  SimpleTokeniser((SimpleTokeniser *)&TStack_98,start,true);
  if ((TStack_98.currentType.text != openDelim.text) &&
     (((openDelim.text == (char *)0x0 || (TStack_98.currentType.text == (char *)0x0)) ||
      (iVar2 = strcmp(TStack_98.currentType.text,openDelim.text), iVar2 != 0)))) {
    throwInternalCompilerError("tokeniser.matches (openDelim)","findEndOfMatchingDelimiter",0x54);
  }
  bVar1 = skipPastMatchingCloseDelimiter((SimpleTokeniser *)&TStack_98,openDelim,closeDelim);
  if (bVar1) {
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)TStack_98.location.sourceCode.object
    ;
    if (TStack_98.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((TStack_98.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((TStack_98.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    (this->super_SOULTokeniser).startLocation.sourceCode.object =
         (SourceCodeText *)TStack_98.location.location.data;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::~Tokeniser(&TStack_98);
    UVar3.data = extraout_RDX;
    if (bVar1) goto LAB_001e6f06;
  }
  else {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::~Tokeniser(&TStack_98);
    UVar3.data = extraout_RDX_00;
  }
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
  (this->super_SOULTokeniser).startLocation.sourceCode.object = (SourceCodeText *)0x0;
LAB_001e6f06:
  CVar4.location.data = UVar3.data;
  CVar4.sourceCode.object = (SourceCodeText *)this;
  return CVar4;
}

Assistant:

static CodeLocation findEndOfMatchingDelimiter (const CodeLocation& start, TokenType openDelim, TokenType closeDelim)
    {
        try
        {
            SimpleTokeniser tokeniser (start, true);
            SOUL_ASSERT (tokeniser.matches (openDelim));

            if (tokeniser.skipPastMatchingCloseDelimiter (openDelim, closeDelim))
                return tokeniser.location;
        }
        catch (const AbortCompilationException&) {}

        return {};
    }